

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  uchar uVar1;
  ushort uVar2;
  stbi__uint32 sVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  char cVar7;
  stbi__uint16 sVar8;
  int iVar9;
  uint uVar10;
  stbi__uint32 sVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  char *pcVar18;
  stbi_uc *psVar19;
  void *pvVar20;
  stbi__context *data;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar21;
  stbi__uint16 *data_02;
  byte *pbVar22;
  uchar *puVar23;
  byte bVar24;
  uint uVar25;
  stbi_uc *psVar26;
  byte *pbVar27;
  stbi_uc sVar28;
  uint uVar29;
  long lVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  uint x_00;
  uint uVar34;
  int iVar35;
  stbi__uint32 sVar36;
  ulong uVar37;
  int iVar38;
  stbi__uint16 *psVar39;
  stbi__uint16 *psVar40;
  long in_FS_OFFSET;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar91;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar112;
  int iVar120;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar121 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  int iVar151;
  int iVar155;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  stbi_uc pal [256] [4];
  uint local_896c;
  uint local_8960;
  uint local_8958;
  stbi__uint16 *local_8930;
  ulong local_8928;
  stbi__uint16 *local_8910;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  psVar26 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  iVar9 = stbi__check_png_header(s);
  psVar21 = s->img_buffer_original;
  s->img_buffer = psVar21;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar9 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar9 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar6 = local_88a8._0_8_;
      if (iVar9 == 0) {
        data = (stbi__context *)0x0;
      }
      else {
        iVar9 = 8;
        if ((8 < local_88a8.flags) && (iVar9 = 0x10, local_88a8.flags != 0x10)) {
          pcVar18 = "bad bits_per_channel";
          goto LAB_00119d2e;
        }
        ri->bits_per_channel = iVar9;
        data = (stbi__context *)local_88a8.history;
        if ((req_comp != 0) && (iVar9 = *(int *)(local_88a8._0_8_ + 0xc), iVar9 != req_comp)) {
          if (local_88a8.flags < 9) {
            data = (stbi__context *)
                   stbi__convert_format
                             (local_88a8.history,iVar9,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data = (stbi__context *)
                   stbi__convert_format16
                             ((stbi__uint16 *)local_88a8.history,iVar9,req_comp,
                              *(stbi__uint32 *)local_88a8._0_8_,
                              *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar6 + 0xc) = req_comp;
          if (data == (stbi__context *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)uVar6;
        *y = *(stbi__uint32 *)(uVar6 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar6 + 8);
        }
        local_88a8.history = (stbi_uc *)0x0;
      }
      free(local_88a8.history);
      free(local_88a8.background);
      goto LAB_0011a1bf;
    }
    pcVar18 = "bad req_comp";
    goto LAB_00119d2e;
  }
  if (psVar21 < s->img_buffer_original_end) {
LAB_00119d6c:
    psVar19 = psVar21 + 1;
    s->img_buffer = psVar19;
    if (*psVar21 != 'B') goto LAB_00119f0a;
    if (s->img_buffer_end <= psVar19) {
      if (s->read_from_callbacks == 0) goto LAB_00119f0a;
      stbi__refill_buffer(s);
      psVar19 = s->img_buffer;
    }
    s->img_buffer = psVar19 + 1;
    if (*psVar19 != 'M') goto LAB_00119f0a;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar10 = stbi__get16le(s);
    iVar9 = stbi__get16le(s);
    uVar10 = iVar9 << 0x10 | uVar10;
    if (((0x38 < uVar10) || ((0x100010000001000U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) &&
       (uVar10 != 0x6c)) {
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      if (uVar10 == 0x7c) goto LAB_00119e37;
      goto LAB_00119f1e;
    }
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00119e37:
    local_88cc.all_a = 0xff;
    pvVar20 = stbi__bmp_parse_header(s,&local_88cc);
    local_8958 = local_88cc.all_a;
    if (pvVar20 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar10 = s->img_y;
    uVar14 = -uVar10;
    if (0 < (int)uVar10) {
      uVar14 = uVar10;
    }
    s->img_y = uVar14;
    if ((uVar14 < 0x1000001) && (s->img_x < 0x1000001)) {
      if (local_88cc.hsz == 0xc) {
        if (0x17 < local_88cc.bpp) goto LAB_0011a497;
        uVar14 = ((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3;
LAB_0011a3bd:
        local_8928 = (ulong)uVar14;
        if (uVar14 == 0) goto LAB_0011a497;
        bVar4 = false;
LAB_0011a3ee:
        bVar5 = local_88cc.ma == 0xff000000;
        iVar9 = 4 - (uint)(local_88cc.ma == 0);
        iVar31 = local_88cc.bpp;
      }
      else {
        if (local_88cc.bpp < 0x10) {
          uVar14 = local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2;
          goto LAB_0011a3bd;
        }
LAB_0011a497:
        iVar9 = (*(int *)&s->img_buffer - *(int *)&s->img_buffer_original) +
                s->callback_already_read;
        if (iVar9 - 0x401U < 0xfffffc00) {
          pcVar18 = "bad header";
          goto LAB_00119d2e;
        }
        if ((local_88cc.offset < iVar9) || (0x400 < local_88cc.offset - iVar9)) {
          pcVar18 = "bad offset";
          goto LAB_00119d2e;
        }
        stbi__skip(s,local_88cc.offset - iVar9);
        local_8928 = 0;
        bVar5 = true;
        bVar4 = bVar5;
        if (local_88cc.bpp != 0x18 || local_88cc.ma != 0xff000000) goto LAB_0011a3ee;
        iVar9 = 3;
        iVar31 = 0x18;
        bVar4 = true;
      }
      s->img_n = iVar9;
      if (2 < req_comp) {
        iVar9 = req_comp;
      }
      sVar11 = s->img_x;
      sVar3 = s->img_y;
      iVar13 = stbi__mad3sizes_valid(iVar9,sVar11,sVar3,0);
      if (iVar13 == 0) goto LAB_0011a873;
      data_00 = (uchar *)stbi__malloc_mad3(iVar9,sVar11,sVar3,0);
      if (data_00 != (uchar *)0x0) {
        if (iVar31 < 0x10) {
          iVar13 = (int)local_8928;
          if (!bVar4 && iVar13 < 0x101) {
            if (0 < iVar13) {
              psVar26 = s->img_buffer;
              uVar37 = 0;
              psVar21 = psVar26;
              do {
                psVar19 = s->img_buffer_end;
                if (psVar26 < psVar19) {
LAB_0011a6c4:
                  psVar21 = psVar26 + 1;
                  s->img_buffer = psVar21;
                  sVar28 = *psVar26;
                  psVar26 = psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar26 = s->img_buffer;
                    psVar19 = s->img_buffer_end;
                    goto LAB_0011a6c4;
                  }
                  sVar28 = '\0';
                }
                local_88a8.pal[uVar37 - 0xd][2] = sVar28;
                if (psVar26 < psVar19) {
LAB_0011a707:
                  psVar21 = psVar26 + 1;
                  s->img_buffer = psVar21;
                  sVar28 = *psVar26;
                  psVar26 = psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar26 = s->img_buffer;
                    psVar19 = s->img_buffer_end;
                    goto LAB_0011a707;
                  }
                  sVar28 = '\0';
                }
                local_88a8.pal[uVar37 - 0xd][1] = sVar28;
                if (psVar26 < psVar19) {
LAB_0011a742:
                  psVar21 = psVar26 + 1;
                  s->img_buffer = psVar21;
                  sVar28 = *psVar26;
                  psVar26 = psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar26 = s->img_buffer;
                    goto LAB_0011a742;
                  }
                  sVar28 = '\0';
                }
                local_88a8.pal[uVar37 - 0xd][0] = sVar28;
                if (local_88cc.hsz != 0xc) {
                  if (s->img_buffer_end <= psVar21) {
                    psVar26 = psVar21;
                    if (s->read_from_callbacks == 0) goto LAB_0011a793;
                    stbi__refill_buffer(s);
                    psVar21 = s->img_buffer;
                  }
                  psVar26 = psVar21 + 1;
                  s->img_buffer = psVar26;
                  psVar21 = psVar26;
                }
LAB_0011a793:
                local_88a8.pal[uVar37 - 0xd][3] = 0xff;
                uVar37 = uVar37 + 1;
              } while (local_8928 != uVar37);
            }
            stbi__skip(s,(iVar13 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (iVar31 == 1) {
              sVar11 = s->img_y;
              if (0 < (int)sVar11) {
                sVar3 = s->img_x;
                iVar13 = 0;
                iVar31 = 0;
                do {
                  pbVar22 = s->img_buffer;
                  if (pbVar22 < s->img_buffer_end) {
LAB_0011b4cc:
                    s->img_buffer = pbVar22 + 1;
                    uVar14 = (uint)*pbVar22;
                    pbVar22 = pbVar22 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar22 = s->img_buffer;
                      goto LAB_0011b4cc;
                    }
                    uVar14 = 0;
                  }
                  sVar11 = s->img_x;
                  if (0 < (int)sVar11) {
                    sVar36 = 0;
                    uVar29 = 7;
                    do {
                      uVar37 = (ulong)((uVar14 >> (uVar29 & 0x1f) & 1) != 0);
                      data_00[iVar13] = local_88a8.pal[uVar37 - 0xd][0];
                      data_00[(long)iVar13 + 1] = local_88a8.pal[uVar37 - 0xd][1];
                      data_00[(long)iVar13 + 2] = local_88a8.pal[uVar37 - 0xd][2];
                      iVar35 = iVar13 + 3;
                      if (iVar9 == 4) {
                        data_00[(long)iVar13 + 3] = 0xff;
                        iVar35 = iVar13 + 4;
                      }
                      iVar13 = iVar35;
                      sVar36 = sVar36 + 1;
                      if (sVar36 == sVar11) break;
                      if ((int)uVar29 < 1) {
                        if (s->img_buffer_end <= pbVar22) {
                          if (s->read_from_callbacks == 0) {
                            uVar14 = 0;
                            uVar29 = 7;
                            goto LAB_0011b594;
                          }
                          stbi__refill_buffer(s);
                          pbVar22 = s->img_buffer;
                          sVar11 = s->img_x;
                        }
                        s->img_buffer = pbVar22 + 1;
                        uVar14 = (uint)*pbVar22;
                        uVar29 = 7;
                        pbVar22 = pbVar22 + 1;
                      }
                      else {
                        uVar29 = uVar29 - 1;
                      }
LAB_0011b594:
                    } while ((int)sVar36 < (int)sVar11);
                  }
                  stbi__skip(s,-(sVar3 + 7 >> 3) & 3);
                  iVar31 = iVar31 + 1;
                  sVar11 = s->img_y;
                } while (iVar31 < (int)sVar11);
              }
            }
            else {
              if (iVar31 == 8) {
                uVar14 = s->img_x;
              }
              else {
                if (iVar31 != 4) {
                  free(data_00);
                  pcVar18 = "bad bpp";
                  goto LAB_00119d2e;
                }
                uVar14 = s->img_x + 1 >> 1;
              }
              sVar11 = s->img_y;
              if (0 < (int)sVar11) {
                uVar37 = 0;
                iVar13 = 0;
                do {
                  if (0 < (int)s->img_x) {
                    pbVar22 = s->img_buffer;
                    iVar35 = 0;
                    do {
                      if (pbVar22 < s->img_buffer_end) {
LAB_0011b337:
                        s->img_buffer = pbVar22 + 1;
                        uVar29 = (uint)*pbVar22;
                        pbVar22 = pbVar22 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          pbVar22 = s->img_buffer;
                          goto LAB_0011b337;
                        }
                        uVar29 = 0;
                      }
                      uVar25 = uVar29 & 0xf;
                      uVar16 = uVar29 >> 4;
                      if (iVar31 != 4) {
                        uVar16 = uVar29;
                      }
                      uVar33 = (ulong)uVar16;
                      if (iVar31 != 4) {
                        uVar25 = 0;
                      }
                      lVar30 = (long)(int)uVar37;
                      uVar32 = lVar30 + 3;
                      data_00[lVar30] = local_88a8.pal[uVar33 - 0xd][0];
                      data_00[lVar30 + 1] = local_88a8.pal[uVar33 - 0xd][1];
                      data_00[lVar30 + 2] = local_88a8.pal[uVar33 - 0xd][2];
                      if (iVar9 == 4) {
                        data_00[lVar30 + 3] = 0xff;
                        uVar32 = (ulong)((int)uVar37 + 4);
                      }
                      if (iVar35 + 1U == s->img_x) {
                        uVar37 = uVar32 & 0xffffffff;
                        break;
                      }
                      if (iVar31 == 8) {
                        if (s->img_buffer_end <= pbVar22) {
                          if (s->read_from_callbacks == 0) {
                            uVar25 = 0;
                            goto LAB_0011b3f8;
                          }
                          stbi__refill_buffer(s);
                          pbVar22 = s->img_buffer;
                        }
                        s->img_buffer = pbVar22 + 1;
                        uVar25 = (uint)*pbVar22;
                        pbVar22 = pbVar22 + 1;
                      }
LAB_0011b3f8:
                      lVar30 = (long)(int)uVar32;
                      uVar37 = lVar30 + 3;
                      uVar33 = (ulong)uVar25;
                      data_00[lVar30] = local_88a8.pal[uVar33 - 0xd][0];
                      data_00[lVar30 + 1] = local_88a8.pal[uVar33 - 0xd][1];
                      data_00[lVar30 + 2] = local_88a8.pal[uVar33 - 0xd][2];
                      if (iVar9 == 4) {
                        data_00[lVar30 + 3] = 0xff;
                        uVar37 = (ulong)((int)uVar32 + 4);
                      }
                      iVar35 = iVar35 + 2;
                    } while (iVar35 < (int)s->img_x);
                  }
                  stbi__skip(s,-uVar14 & 3);
                  iVar13 = iVar13 + 1;
                  sVar11 = s->img_y;
                } while (iVar13 < (int)sVar11);
              }
            }
            goto LAB_0011b5d6;
          }
          free(data_00);
          pcVar18 = "invalid";
          goto LAB_00119d2e;
        }
        stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
        if (iVar31 != 0x10) {
          if (iVar31 == 0x20) {
            local_896c = 0;
            if ((bool)((local_88cc.mr == 0xff0000 &&
                       (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff)) & bVar5)) {
              bVar4 = true;
              goto LAB_0011a8b4;
            }
            goto LAB_0011a905;
          }
          local_896c = 0;
          if (iVar31 != 0x18) goto LAB_0011a905;
          local_896c = s->img_x & 3;
          bVar4 = false;
LAB_0011a8b4:
          bVar5 = false;
          iVar151 = 0;
          iVar13 = 0;
          iVar35 = 0;
          iVar15 = 0;
          local_8960 = 0;
          uVar14 = 0;
          uVar29 = 0;
          uVar16 = 0;
LAB_0011aa05:
          sVar11 = s->img_y;
          if (0 < (int)sVar11) {
            iVar120 = 0;
            iVar155 = 0;
            do {
              if (bVar5) {
                if (0 < (int)s->img_x) {
                  iVar38 = 0;
                  do {
                    uVar25 = stbi__get16le(s);
                    if (iVar31 != 0x10) {
                      iVar17 = stbi__get16le(s);
                      uVar25 = uVar25 | iVar17 << 0x10;
                    }
                    iVar17 = stbi__shiftsigned(uVar25 & local_88cc.mr,iVar151,local_8960);
                    data_00[iVar120] = (uchar)iVar17;
                    iVar17 = stbi__shiftsigned(uVar25 & local_88cc.mg,iVar13,uVar14);
                    data_00[(long)iVar120 + 1] = (uchar)iVar17;
                    iVar17 = stbi__shiftsigned(uVar25 & local_88cc.mb,iVar35,uVar29);
                    data_00[(long)iVar120 + 2] = (uchar)iVar17;
                    if (local_88cc.ma == 0) {
                      uVar25 = 0xff;
                    }
                    else {
                      uVar25 = stbi__shiftsigned(uVar25 & local_88cc.ma,iVar15,uVar16);
                    }
                    iVar17 = iVar120 + 3;
                    if (iVar9 == 4) {
                      data_00[(long)iVar120 + 3] = (uchar)uVar25;
                      iVar17 = iVar120 + 4;
                    }
                    iVar120 = iVar17;
                    local_8958 = local_8958 | uVar25;
                    iVar38 = iVar38 + 1;
                  } while (iVar38 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                pbVar22 = s->img_buffer;
                iVar38 = 0;
                do {
                  pbVar27 = s->img_buffer_end;
                  if (pbVar22 < pbVar27) {
LAB_0011ab63:
                    s->img_buffer = pbVar22 + 1;
                    bVar24 = *pbVar22;
                    pbVar22 = pbVar22 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar22 = s->img_buffer;
                      pbVar27 = s->img_buffer_end;
                      goto LAB_0011ab63;
                    }
                    bVar24 = 0;
                  }
                  data_00[(long)iVar120 + 2] = bVar24;
                  if (pbVar22 < pbVar27) {
LAB_0011abaa:
                    s->img_buffer = pbVar22 + 1;
                    bVar24 = *pbVar22;
                    pbVar22 = pbVar22 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar22 = s->img_buffer;
                      pbVar27 = s->img_buffer_end;
                      goto LAB_0011abaa;
                    }
                    bVar24 = 0;
                  }
                  data_00[(long)iVar120 + 1] = bVar24;
                  if (pbVar22 < pbVar27) {
LAB_0011abe6:
                    s->img_buffer = pbVar22 + 1;
                    bVar24 = *pbVar22;
                    pbVar22 = pbVar22 + 1;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar22 = s->img_buffer;
                      goto LAB_0011abe6;
                    }
                    bVar24 = 0;
                  }
                  data_00[iVar120] = bVar24;
                  bVar24 = 0xff;
                  if (bVar4) {
                    if (s->img_buffer_end <= pbVar22) {
                      if (s->read_from_callbacks == 0) {
                        bVar24 = 0;
                        goto LAB_0011ac3d;
                      }
                      stbi__refill_buffer(s);
                      pbVar22 = s->img_buffer;
                    }
                    s->img_buffer = pbVar22 + 1;
                    bVar24 = *pbVar22;
                    pbVar22 = pbVar22 + 1;
                  }
LAB_0011ac3d:
                  iVar17 = iVar120 + 3;
                  if (iVar9 == 4) {
                    data_00[(long)iVar120 + 3] = bVar24;
                    iVar17 = iVar120 + 4;
                  }
                  iVar120 = iVar17;
                  local_8958 = local_8958 | bVar24;
                  iVar38 = iVar38 + 1;
                } while (iVar38 < (int)s->img_x);
              }
              stbi__skip(s,local_896c);
              iVar155 = iVar155 + 1;
              sVar11 = s->img_y;
            } while (iVar155 < (int)sVar11);
          }
LAB_0011b5d6:
          auVar77 = _DAT_0015ad30;
          auVar125 = _DAT_0015ad20;
          auVar73 = _DAT_0015ad10;
          auVar52 = _DAT_0015ad00;
          auVar127 = _DAT_0015acf0;
          auVar43 = _DAT_0015ace0;
          auVar121 = _DAT_00154640;
          if (((iVar9 == 4) && (local_8958 == 0)) &&
             (uVar14 = s->img_x * sVar11 * 4 - 1, -1 < (int)uVar14)) {
            uVar29 = uVar14 >> 2;
            auVar78._4_4_ = 0;
            auVar78._0_4_ = uVar29;
            auVar78._8_4_ = uVar29;
            auVar78._12_4_ = 0;
            puVar23 = data_00 + uVar14;
            uVar37 = 0;
            auVar47._8_4_ = 0xffffffff;
            auVar47._0_8_ = 0xffffffffffffffff;
            auVar47._12_4_ = 0xffffffff;
            do {
              auVar128._8_4_ = (int)uVar37;
              auVar128._0_8_ = uVar37;
              auVar128._12_4_ = (int)(uVar37 >> 0x20);
              auVar130 = auVar78 | auVar121;
              auVar132 = (auVar128 | auVar77) ^ auVar121;
              iVar31 = auVar130._0_4_;
              iVar151 = -(uint)(iVar31 < auVar132._0_4_);
              iVar13 = auVar130._4_4_;
              auVar134._4_4_ = -(uint)(iVar13 < auVar132._4_4_);
              iVar35 = auVar130._8_4_;
              iVar155 = -(uint)(iVar35 < auVar132._8_4_);
              iVar15 = auVar130._12_4_;
              auVar134._12_4_ = -(uint)(iVar15 < auVar132._12_4_);
              auVar144._4_4_ = iVar151;
              auVar144._0_4_ = iVar151;
              auVar144._8_4_ = iVar155;
              auVar144._12_4_ = iVar155;
              auVar130 = pshuflw(in_XMM1,auVar144,0xe8);
              auVar133._4_4_ = -(uint)(auVar132._4_4_ == iVar13);
              auVar133._12_4_ = -(uint)(auVar132._12_4_ == iVar15);
              auVar133._0_4_ = auVar133._4_4_;
              auVar133._8_4_ = auVar133._12_4_;
              auVar67 = pshuflw(in_XMM2,auVar133,0xe8);
              auVar134._0_4_ = auVar134._4_4_;
              auVar134._8_4_ = auVar134._12_4_;
              auVar132 = pshuflw(auVar130,auVar134,0xe8);
              auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar47;
              auVar130 = packssdw(auVar130,auVar130);
              if ((auVar130 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                *puVar23 = 0xff;
              }
              auVar134 = auVar133 & auVar144 | auVar134;
              auVar130 = packssdw(auVar134,auVar134);
              auVar130 = packssdw(auVar130 ^ auVar47,auVar130 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._0_4_ >> 8 & 1) != 0) {
                puVar23[-4] = 0xff;
              }
              auVar130 = (auVar128 | auVar125) ^ auVar121;
              auVar132._0_4_ = -(uint)(iVar31 < auVar130._0_4_);
              auVar132._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
              auVar132._8_4_ = -(uint)(iVar35 < auVar130._8_4_);
              auVar132._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
              auVar67._4_4_ = auVar132._0_4_;
              auVar67._0_4_ = auVar132._0_4_;
              auVar67._8_4_ = auVar132._8_4_;
              auVar67._12_4_ = auVar132._8_4_;
              iVar151 = -(uint)(auVar130._4_4_ == iVar13);
              iVar155 = -(uint)(auVar130._12_4_ == iVar15);
              auVar145._4_4_ = iVar151;
              auVar145._0_4_ = iVar151;
              auVar145._8_4_ = iVar155;
              auVar145._12_4_ = iVar155;
              auVar152._4_4_ = auVar132._4_4_;
              auVar152._0_4_ = auVar132._4_4_;
              auVar152._8_4_ = auVar132._12_4_;
              auVar152._12_4_ = auVar132._12_4_;
              auVar130 = auVar145 & auVar67 | auVar152;
              auVar130 = packssdw(auVar130,auVar130);
              auVar130 = packssdw(auVar130 ^ auVar47,auVar130 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._0_4_ >> 0x10 & 1) != 0) {
                puVar23[-8] = 0xff;
              }
              auVar130 = pshufhw(auVar130,auVar67,0x84);
              auVar67 = pshufhw(auVar132,auVar145,0x84);
              auVar132 = pshufhw(auVar130,auVar152,0x84);
              auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar47;
              auVar130 = packssdw(auVar130,auVar130);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._0_4_ >> 0x18 & 1) != 0) {
                puVar23[-0xc] = 0xff;
              }
              auVar130 = (auVar128 | auVar73) ^ auVar121;
              auVar68._0_4_ = -(uint)(iVar31 < auVar130._0_4_);
              auVar68._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
              auVar68._8_4_ = -(uint)(iVar35 < auVar130._8_4_);
              auVar68._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
              auVar146._4_4_ = auVar68._0_4_;
              auVar146._0_4_ = auVar68._0_4_;
              auVar146._8_4_ = auVar68._8_4_;
              auVar146._12_4_ = auVar68._8_4_;
              auVar67 = pshuflw(auVar152,auVar146,0xe8);
              auVar49._0_4_ = -(uint)(auVar130._0_4_ == iVar31);
              auVar49._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
              auVar49._8_4_ = -(uint)(auVar130._8_4_ == iVar35);
              auVar49._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
              auVar135._4_4_ = auVar49._4_4_;
              auVar135._0_4_ = auVar49._4_4_;
              auVar135._8_4_ = auVar49._12_4_;
              auVar135._12_4_ = auVar49._12_4_;
              auVar130 = pshuflw(auVar49,auVar135,0xe8);
              auVar136._4_4_ = auVar68._4_4_;
              auVar136._0_4_ = auVar68._4_4_;
              auVar136._8_4_ = auVar68._12_4_;
              auVar136._12_4_ = auVar68._12_4_;
              auVar132 = pshuflw(auVar68,auVar136,0xe8);
              auVar130 = packssdw(auVar130 & auVar67,(auVar132 | auVar130 & auVar67) ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar23[-0x10] = 0xff;
              }
              auVar136 = auVar135 & auVar146 | auVar136;
              auVar132 = packssdw(auVar136,auVar136);
              auVar130 = packssdw(auVar130,auVar132 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._4_2_ >> 8 & 1) != 0) {
                puVar23[-0x14] = 0xff;
              }
              auVar130 = (auVar128 | auVar52) ^ auVar121;
              auVar69._0_4_ = -(uint)(iVar31 < auVar130._0_4_);
              auVar69._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
              auVar69._8_4_ = -(uint)(iVar35 < auVar130._8_4_);
              auVar69._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
              auVar137._4_4_ = auVar69._0_4_;
              auVar137._0_4_ = auVar69._0_4_;
              auVar137._8_4_ = auVar69._8_4_;
              auVar137._12_4_ = auVar69._8_4_;
              iVar151 = -(uint)(auVar130._4_4_ == iVar13);
              iVar155 = -(uint)(auVar130._12_4_ == iVar15);
              auVar147._4_4_ = iVar151;
              auVar147._0_4_ = iVar151;
              auVar147._8_4_ = iVar155;
              auVar147._12_4_ = iVar155;
              auVar153._4_4_ = auVar69._4_4_;
              auVar153._0_4_ = auVar69._4_4_;
              auVar153._8_4_ = auVar69._12_4_;
              auVar153._12_4_ = auVar69._12_4_;
              auVar130 = auVar147 & auVar137 | auVar153;
              auVar130 = packssdw(auVar130,auVar130);
              auVar130 = packssdw(auVar130 ^ auVar47,auVar130 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar23[-0x18] = 0xff;
              }
              auVar130 = pshufhw(auVar130,auVar137,0x84);
              auVar67 = pshufhw(auVar69,auVar147,0x84);
              auVar132 = pshufhw(auVar130,auVar153,0x84);
              auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar47;
              auVar130 = packssdw(auVar130,auVar130);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._6_2_ >> 8 & 1) != 0) {
                puVar23[-0x1c] = 0xff;
              }
              auVar130 = (auVar128 | auVar127) ^ auVar121;
              auVar70._0_4_ = -(uint)(iVar31 < auVar130._0_4_);
              auVar70._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
              auVar70._8_4_ = -(uint)(iVar35 < auVar130._8_4_);
              auVar70._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
              auVar148._4_4_ = auVar70._0_4_;
              auVar148._0_4_ = auVar70._0_4_;
              auVar148._8_4_ = auVar70._8_4_;
              auVar148._12_4_ = auVar70._8_4_;
              auVar67 = pshuflw(auVar153,auVar148,0xe8);
              auVar50._0_4_ = -(uint)(auVar130._0_4_ == iVar31);
              auVar50._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
              auVar50._8_4_ = -(uint)(auVar130._8_4_ == iVar35);
              auVar50._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
              auVar138._4_4_ = auVar50._4_4_;
              auVar138._0_4_ = auVar50._4_4_;
              auVar138._8_4_ = auVar50._12_4_;
              auVar138._12_4_ = auVar50._12_4_;
              auVar130 = pshuflw(auVar50,auVar138,0xe8);
              auVar139._4_4_ = auVar70._4_4_;
              auVar139._0_4_ = auVar70._4_4_;
              auVar139._8_4_ = auVar70._12_4_;
              auVar139._12_4_ = auVar70._12_4_;
              auVar132 = pshuflw(auVar70,auVar139,0xe8);
              auVar132 = (auVar132 | auVar130 & auVar67) ^ auVar47;
              auVar132 = packssdw(auVar132,auVar132);
              auVar130 = packsswb(auVar130 & auVar67,auVar132);
              if ((auVar130 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar23[-0x20] = 0xff;
              }
              auVar139 = auVar138 & auVar148 | auVar139;
              auVar132 = packssdw(auVar139,auVar139);
              auVar132 = packssdw(auVar132 ^ auVar47,auVar132 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar132);
              if ((auVar130._8_2_ >> 8 & 1) != 0) {
                puVar23[-0x24] = 0xff;
              }
              auVar130 = (auVar128 | auVar43) ^ auVar121;
              auVar71._0_4_ = -(uint)(iVar31 < auVar130._0_4_);
              auVar71._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
              auVar71._8_4_ = -(uint)(iVar35 < auVar130._8_4_);
              auVar71._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
              auVar140._4_4_ = auVar71._0_4_;
              auVar140._0_4_ = auVar71._0_4_;
              auVar140._8_4_ = auVar71._8_4_;
              auVar140._12_4_ = auVar71._8_4_;
              iVar151 = -(uint)(auVar130._4_4_ == iVar13);
              iVar155 = -(uint)(auVar130._12_4_ == iVar15);
              auVar149._4_4_ = iVar151;
              auVar149._0_4_ = iVar151;
              auVar149._8_4_ = iVar155;
              auVar149._12_4_ = iVar155;
              auVar154._4_4_ = auVar71._4_4_;
              auVar154._0_4_ = auVar71._4_4_;
              auVar154._8_4_ = auVar71._12_4_;
              auVar154._12_4_ = auVar71._12_4_;
              auVar130 = auVar149 & auVar140 | auVar154;
              auVar130 = packssdw(auVar130,auVar130);
              auVar130 = packssdw(auVar130 ^ auVar47,auVar130 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar23[-0x28] = 0xff;
              }
              auVar130 = pshufhw(auVar130,auVar140,0x84);
              auVar67 = pshufhw(auVar71,auVar149,0x84);
              auVar132 = pshufhw(auVar130,auVar154,0x84);
              auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar47;
              auVar130 = packssdw(auVar130,auVar130);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._10_2_ >> 8 & 1) != 0) {
                puVar23[-0x2c] = 0xff;
              }
              auVar130 = (auVar128 | _DAT_0015acd0) ^ auVar121;
              auVar72._0_4_ = -(uint)(iVar31 < auVar130._0_4_);
              auVar72._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
              auVar72._8_4_ = -(uint)(iVar35 < auVar130._8_4_);
              auVar72._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
              auVar150._4_4_ = auVar72._0_4_;
              auVar150._0_4_ = auVar72._0_4_;
              auVar150._8_4_ = auVar72._8_4_;
              auVar150._12_4_ = auVar72._8_4_;
              auVar67 = pshuflw(auVar154,auVar150,0xe8);
              auVar51._0_4_ = -(uint)(auVar130._0_4_ == iVar31);
              auVar51._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
              auVar51._8_4_ = -(uint)(auVar130._8_4_ == iVar35);
              auVar51._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
              auVar141._4_4_ = auVar51._4_4_;
              auVar141._0_4_ = auVar51._4_4_;
              auVar141._8_4_ = auVar51._12_4_;
              auVar141._12_4_ = auVar51._12_4_;
              auVar130 = pshuflw(auVar51,auVar141,0xe8);
              auVar142._4_4_ = auVar72._4_4_;
              auVar142._0_4_ = auVar72._4_4_;
              auVar142._8_4_ = auVar72._12_4_;
              auVar142._12_4_ = auVar72._12_4_;
              auVar132 = pshuflw(auVar72,auVar142,0xe8);
              auVar130 = packssdw(auVar130 & auVar67,(auVar132 | auVar130 & auVar67) ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar23[-0x30] = 0xff;
              }
              auVar142 = auVar141 & auVar150 | auVar142;
              auVar132 = packssdw(auVar142,auVar142);
              auVar130 = packssdw(auVar130,auVar132 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130._12_2_ >> 8 & 1) != 0) {
                puVar23[-0x34] = 0xff;
              }
              auVar132 = (auVar128 | _DAT_0015acc0) ^ auVar121;
              auVar130._0_4_ = -(uint)(iVar31 < auVar132._0_4_);
              auVar130._4_4_ = -(uint)(iVar13 < auVar132._4_4_);
              auVar130._8_4_ = -(uint)(iVar35 < auVar132._8_4_);
              auVar130._12_4_ = -(uint)(iVar15 < auVar132._12_4_);
              auVar143._4_4_ = auVar130._0_4_;
              auVar143._0_4_ = auVar130._0_4_;
              auVar143._8_4_ = auVar130._8_4_;
              auVar143._12_4_ = auVar130._8_4_;
              auVar129._4_4_ = -(uint)(auVar132._4_4_ == iVar13);
              auVar129._12_4_ = -(uint)(auVar132._12_4_ == iVar15);
              auVar129._0_4_ = auVar129._4_4_;
              auVar129._8_4_ = auVar129._12_4_;
              auVar131._4_4_ = auVar130._4_4_;
              auVar131._0_4_ = auVar130._4_4_;
              auVar131._8_4_ = auVar130._12_4_;
              auVar131._12_4_ = auVar130._12_4_;
              auVar132 = auVar129 & auVar143 | auVar131;
              auVar130 = packssdw(auVar130,auVar132);
              auVar130 = packssdw(auVar130 ^ auVar47,auVar130 ^ auVar47);
              auVar130 = packsswb(auVar130,auVar130);
              if ((auVar130 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar23[-0x38] = 0xff;
              }
              auVar130 = pshufhw(auVar130,auVar143,0x84);
              in_XMM2 = pshufhw(auVar132,auVar129,0x84);
              in_XMM2 = in_XMM2 & auVar130;
              auVar130 = pshufhw(auVar130,auVar131,0x84);
              auVar130 = (auVar130 | in_XMM2) ^ auVar47;
              auVar130 = packssdw(auVar130,auVar130);
              in_XMM1 = packsswb(auVar130,auVar130);
              if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                puVar23[-0x3c] = 0xff;
              }
              uVar37 = uVar37 + 0x10;
              puVar23 = puVar23 + -0x40;
            } while ((uVar29 + 0x10 & 0x3ffffff0) != uVar37);
          }
          if ((int)uVar10 < 1) {
            uVar10 = s->img_x;
          }
          else {
            uVar10 = s->img_x;
            if (0 < (int)sVar11 >> 1) {
              uVar14 = uVar10 * iVar9;
              uVar29 = (sVar11 - 1) * uVar14;
              uVar37 = 0;
              uVar33 = 0;
              do {
                if (0 < (int)uVar14) {
                  uVar32 = 0;
                  do {
                    uVar1 = data_00[uVar32 + uVar37];
                    data_00[uVar32 + uVar37] = data_00[uVar32 + uVar29];
                    data_00[uVar32 + uVar29] = uVar1;
                    uVar32 = uVar32 + 1;
                  } while (uVar14 != uVar32);
                }
                uVar33 = uVar33 + 1;
                uVar29 = uVar29 - uVar14;
                uVar37 = (ulong)((int)uVar37 + uVar14);
              } while (uVar33 != (uint)((int)sVar11 >> 1));
            }
          }
          if ((req_comp != 0) && (iVar9 != req_comp)) {
            data_00 = stbi__convert_format(data_00,iVar9,req_comp,uVar10,sVar11);
            if (data_00 == (uchar *)0x0) {
              return (void *)0x0;
            }
            uVar10 = s->img_x;
          }
          *x = uVar10;
          *y = s->img_y;
          if (comp != (int *)0x0) {
            *comp = s->img_n;
            return data_00;
          }
          return data_00;
        }
        local_896c = s->img_x * 2 & 2;
LAB_0011a905:
        if ((local_88cc.mg != 0 && local_88cc.mr != 0) && local_88cc.mb != 0) {
          iVar151 = stbi__high_bit(local_88cc.mr);
          local_8960 = stbi__bitcount(local_88cc.mr);
          iVar13 = stbi__high_bit(local_88cc.mg);
          uVar14 = stbi__bitcount(local_88cc.mg);
          iVar35 = stbi__high_bit(local_88cc.mb);
          uVar29 = stbi__bitcount(local_88cc.mb);
          iVar15 = stbi__high_bit(local_88cc.ma);
          uVar16 = stbi__bitcount(local_88cc.ma);
          if ((uVar29 < 9 && (uVar14 < 9 && local_8960 < 9)) && uVar16 < 9) {
            iVar151 = iVar151 + -7;
            iVar13 = iVar13 + -7;
            iVar35 = iVar35 + -7;
            iVar15 = iVar15 + -7;
            bVar5 = true;
            bVar4 = false;
            goto LAB_0011aa05;
          }
        }
        free(data_00);
        pcVar18 = "bad masks";
        goto LAB_00119d2e;
      }
LAB_0011b2bc:
      pcVar18 = "outofmem";
      goto LAB_00119d2e;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar21 = s->img_buffer;
      goto LAB_00119d6c;
    }
LAB_00119f0a:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
LAB_00119f1e:
    iVar9 = stbi__gif_test(s);
    if (iVar9 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar26);
      if (data == (stbi__context *)0x0 || data == s) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      local_88a8.out = local_88a8.background;
LAB_0011a1bf:
      free(local_88a8.out);
      return data;
    }
    iVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar10 | iVar9 << 0x10) != 0x38425053) {
      iVar9 = stbi__pic_test(s);
      if (iVar9 != 0) {
        pvVar20 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar20;
      }
      iVar9 = stbi__jpeg_test(s);
      if (iVar9 != 0) {
        pvVar20 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar20;
      }
      iVar9 = stbi__pnm_test(s);
      if (iVar9 != 0) {
        pvVar20 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar20;
      }
      iVar9 = stbi__hdr_test(s);
      if (iVar9 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar21 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar21;
      }
      iVar9 = stbi__tga_test(s);
      if (iVar9 != 0) {
        pvVar20 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar20;
      }
      pcVar18 = "unknown image type";
      goto LAB_00119d2e;
    }
    iVar9 = stbi__get16be(s);
    uVar10 = stbi__get16be(s);
    if ((uVar10 | iVar9 << 0x10) != 0x38425053) {
      pcVar18 = "not PSD";
      goto LAB_00119d2e;
    }
    iVar9 = stbi__get16be(s);
    if (iVar9 != 1) {
      pcVar18 = "wrong version";
      goto LAB_00119d2e;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar21 = s->img_buffer;
LAB_0011a284:
      s->img_buffer = psVar21 + 6;
    }
    else {
      psVar21 = s->img_buffer;
      iVar9 = (int)s->img_buffer_end - (int)psVar21;
      if (5 < iVar9) goto LAB_0011a284;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar9);
    }
    uVar10 = stbi__get16be(s);
    if (0x10 < uVar10) {
      pcVar18 = "wrong channel count";
      goto LAB_00119d2e;
    }
    iVar9 = stbi__get16be(s);
    uVar25 = iVar9 * 0x10000;
    uVar14 = stbi__get16be(s);
    uVar16 = uVar25 + uVar14;
    iVar9 = stbi__get16be(s);
    uVar29 = stbi__get16be(s);
    if ((int)uVar16 < 0x1000001) {
      uVar34 = iVar9 * 0x10000;
      x_00 = uVar34 + uVar29;
      if ((int)x_00 < 0x1000001) {
        iVar9 = stbi__get16be(s);
        if ((iVar9 != 8) && (iVar9 != 0x10)) {
          pcVar18 = "unsupported bit depth";
          goto LAB_00119d2e;
        }
        iVar31 = stbi__get16be(s);
        if (iVar31 != 3) {
          pcVar18 = "wrong color format";
          goto LAB_00119d2e;
        }
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        uVar12 = stbi__get16be(s);
        if (1 < uVar12) {
          pcVar18 = "bad compression";
          goto LAB_00119d2e;
        }
        iVar31 = stbi__mad3sizes_valid(4,x_00,uVar16,0);
        if (iVar31 != 0) {
          if (((bpc == 0x10) && (iVar9 == 0x10)) && (uVar12 == 0)) {
            data_02 = (stbi__uint16 *)stbi__malloc_mad3(8,x_00,uVar16,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            data_02 = (stbi__uint16 *)malloc((long)(int)(uVar16 * x_00 * 4));
          }
          if (data_02 != (stbi__uint16 *)0x0) {
            iVar31 = x_00 * uVar16;
            if (uVar12 == 0) {
              lVar30 = (ulong)((uVar14 | uVar25) * (uVar29 | uVar34)) - 1;
              auVar43._8_4_ = (int)lVar30;
              auVar43._0_8_ = lVar30;
              auVar43._12_4_ = (int)((ulong)lVar30 >> 0x20);
              psVar40 = data_02 + 0x1e;
              uVar12 = (uVar14 + uVar25) * (uVar29 + uVar34);
              psVar39 = data_02 + 0x1c;
              uVar37 = 0;
              auVar127._8_4_ = 0xffffffff;
              auVar127._0_8_ = 0xffffffffffffffff;
              auVar127._12_4_ = 0xffffffff;
              auVar121 = _DAT_00154640;
              local_8930 = data_02;
              local_8910 = data_02;
              do {
                if (uVar37 < uVar10) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar31) {
                      lVar30 = 0;
                      do {
                        iVar13 = stbi__get16be(s);
                        auVar121 = _DAT_00154640;
                        auVar127._8_4_ = 0xffffffff;
                        auVar127._0_8_ = 0xffffffffffffffff;
                        auVar127._12_4_ = 0xffffffff;
                        local_8930[lVar30 * 4] = (stbi__uint16)iVar13;
                        lVar30 = lVar30 + 1;
                      } while (uVar12 != (uint)lVar30);
                    }
                  }
                  else if (iVar9 == 0x10) {
                    if (0 < iVar31) {
                      lVar30 = 0;
                      do {
                        iVar13 = stbi__get16be(s);
                        auVar121 = _DAT_00154640;
                        auVar127._8_4_ = 0xffffffff;
                        auVar127._0_8_ = 0xffffffffffffffff;
                        auVar127._12_4_ = 0xffffffff;
                        *(char *)(local_8910 + lVar30 * 2) = (char)((uint)iVar13 >> 8);
                        lVar30 = lVar30 + 1;
                      } while (uVar12 - (int)lVar30 != 0);
                    }
                  }
                  else if (0 < iVar31) {
                    psVar21 = s->img_buffer;
                    lVar30 = 0;
                    do {
                      if (psVar21 < s->img_buffer_end) {
LAB_0011c465:
                        s->img_buffer = psVar21 + 1;
                        sVar28 = *psVar21;
                        psVar21 = psVar21 + 1;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          auVar127._8_4_ = 0xffffffff;
                          auVar127._0_8_ = 0xffffffffffffffff;
                          auVar127._12_4_ = 0xffffffff;
                          psVar21 = s->img_buffer;
                          auVar121 = _DAT_00154640;
                          goto LAB_0011c465;
                        }
                        sVar28 = '\0';
                      }
                      *(stbi_uc *)(local_8910 + lVar30 * 2) = sVar28;
                      lVar30 = lVar30 + 1;
                    } while (uVar12 - (int)lVar30 != 0);
                  }
                }
                else if (iVar9 == 0x10 && bpc == 0x10) {
                  if (0 < iVar31) {
                    sVar8 = -(ushort)(uVar37 == 3);
                    uVar33 = 0;
                    do {
                      auVar44._8_4_ = (int)uVar33;
                      auVar44._0_8_ = uVar33;
                      auVar44._12_4_ = (int)(uVar33 >> 0x20);
                      auVar52 = auVar43 ^ auVar121;
                      auVar73 = (auVar44 | _DAT_0015ad30) ^ auVar121;
                      iVar13 = auVar52._0_4_;
                      iVar155 = -(uint)(iVar13 < auVar73._0_4_);
                      iVar35 = auVar52._4_4_;
                      auVar75._4_4_ = -(uint)(iVar35 < auVar73._4_4_);
                      iVar15 = auVar52._8_4_;
                      iVar120 = -(uint)(iVar15 < auVar73._8_4_);
                      iVar151 = auVar52._12_4_;
                      auVar75._12_4_ = -(uint)(iVar151 < auVar73._12_4_);
                      auVar100._4_4_ = iVar155;
                      auVar100._0_4_ = iVar155;
                      auVar100._8_4_ = iVar120;
                      auVar100._12_4_ = iVar120;
                      auVar52 = pshuflw(in_XMM5,auVar100,0xe8);
                      auVar74._4_4_ = -(uint)(auVar73._4_4_ == iVar35);
                      auVar74._12_4_ = -(uint)(auVar73._12_4_ == iVar151);
                      auVar74._0_4_ = auVar74._4_4_;
                      auVar74._8_4_ = auVar74._12_4_;
                      auVar125 = pshuflw(in_XMM6,auVar74,0xe8);
                      auVar75._0_4_ = auVar75._4_4_;
                      auVar75._8_4_ = auVar75._12_4_;
                      auVar73 = pshuflw(auVar52,auVar75,0xe8);
                      auVar73 = (auVar73 | auVar125 & auVar52) ^ auVar127;
                      auVar73 = packssdw(auVar73,auVar73);
                      if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4 + 0xffffffffffffffe4] = sVar8;
                      }
                      auVar75 = auVar74 & auVar100 | auVar75;
                      auVar73 = packssdw(auVar75,auVar75);
                      auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                      if ((auVar73._0_4_ >> 0x10 & 1) != 0) {
                        psVar39[uVar33 * 4 + 0xffffffffffffffe8] = sVar8;
                      }
                      auVar73 = (auVar44 | _DAT_0015ad20) ^ auVar121;
                      iVar155 = -(uint)(iVar13 < auVar73._0_4_);
                      auVar116._4_4_ = -(uint)(iVar35 < auVar73._4_4_);
                      iVar120 = -(uint)(iVar15 < auVar73._8_4_);
                      auVar116._12_4_ = -(uint)(iVar151 < auVar73._12_4_);
                      auVar76._4_4_ = iVar155;
                      auVar76._0_4_ = iVar155;
                      auVar76._8_4_ = iVar120;
                      auVar76._12_4_ = iVar120;
                      auVar101._4_4_ = -(uint)(auVar73._4_4_ == iVar35);
                      auVar101._12_4_ = -(uint)(auVar73._12_4_ == iVar151);
                      auVar101._0_4_ = auVar101._4_4_;
                      auVar101._8_4_ = auVar101._12_4_;
                      auVar116._0_4_ = auVar116._4_4_;
                      auVar116._8_4_ = auVar116._12_4_;
                      auVar73 = auVar101 & auVar76 | auVar116;
                      auVar73 = packssdw(auVar73,auVar73);
                      auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                      if ((auVar73 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4 + 0xffffffffffffffec] = sVar8;
                      }
                      auVar77 = pshufhw(auVar76,auVar76,0x84);
                      auVar47 = pshufhw(auVar101,auVar101,0x84);
                      auVar78 = pshufhw(auVar77,auVar116,0x84);
                      auVar77 = (auVar78 | auVar47 & auVar77) ^ auVar127;
                      auVar77 = packssdw(auVar77,auVar77);
                      if ((auVar77 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4 + 0xfffffffffffffff0] = sVar8;
                      }
                      auVar77 = (auVar44 | _DAT_0015ad10) ^ auVar121;
                      iVar155 = -(uint)(iVar13 < auVar77._0_4_);
                      auVar80._4_4_ = -(uint)(iVar35 < auVar77._4_4_);
                      iVar120 = -(uint)(iVar15 < auVar77._8_4_);
                      auVar80._12_4_ = -(uint)(iVar151 < auVar77._12_4_);
                      auVar102._4_4_ = iVar155;
                      auVar102._0_4_ = iVar155;
                      auVar102._8_4_ = iVar120;
                      auVar102._12_4_ = iVar120;
                      auVar73 = pshuflw(auVar73,auVar102,0xe8);
                      auVar79._4_4_ = -(uint)(auVar77._4_4_ == iVar35);
                      auVar79._12_4_ = -(uint)(auVar77._12_4_ == iVar151);
                      auVar79._0_4_ = auVar79._4_4_;
                      auVar79._8_4_ = auVar79._12_4_;
                      in_XMM6 = pshuflw(auVar125 & auVar52,auVar79,0xe8);
                      in_XMM6 = in_XMM6 & auVar73;
                      auVar80._0_4_ = auVar80._4_4_;
                      auVar80._8_4_ = auVar80._12_4_;
                      auVar52 = pshuflw(auVar73,auVar80,0xe8);
                      auVar52 = (auVar52 | in_XMM6) ^ auVar127;
                      in_XMM5 = packssdw(auVar52,auVar52);
                      if ((in_XMM5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4 + 0xfffffffffffffff4] = sVar8;
                      }
                      auVar80 = auVar79 & auVar102 | auVar80;
                      auVar52 = packssdw(auVar80,auVar80);
                      auVar52 = packssdw(auVar52 ^ auVar127,auVar52 ^ auVar127);
                      if ((auVar52 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4 + 0xfffffffffffffff8] = sVar8;
                      }
                      auVar52 = (auVar44 | _DAT_0015ad00) ^ auVar121;
                      auVar103._0_4_ = -(uint)(iVar13 < auVar52._0_4_);
                      auVar103._4_4_ = -(uint)(iVar35 < auVar52._4_4_);
                      auVar103._8_4_ = -(uint)(iVar15 < auVar52._8_4_);
                      auVar103._12_4_ = -(uint)(iVar151 < auVar52._12_4_);
                      auVar81._4_4_ = auVar103._0_4_;
                      auVar81._0_4_ = auVar103._0_4_;
                      auVar81._8_4_ = auVar103._8_4_;
                      auVar81._12_4_ = auVar103._8_4_;
                      auVar45._4_4_ = -(uint)(auVar52._4_4_ == iVar35);
                      auVar45._12_4_ = -(uint)(auVar52._12_4_ == iVar151);
                      auVar45._0_4_ = auVar45._4_4_;
                      auVar45._8_4_ = auVar45._12_4_;
                      auVar53._4_4_ = auVar103._4_4_;
                      auVar53._0_4_ = auVar103._4_4_;
                      auVar53._8_4_ = auVar103._12_4_;
                      auVar53._12_4_ = auVar103._12_4_;
                      auVar52 = packssdw(auVar103,auVar45 & auVar81 | auVar53);
                      auVar52 = packssdw(auVar52 ^ auVar127,auVar52 ^ auVar127);
                      if ((auVar52 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4 + 0xfffffffffffffffc] = sVar8;
                      }
                      auVar125 = pshufhw(auVar81,auVar81,0x84);
                      auVar52 = pshufhw(auVar45,auVar45,0x84);
                      auVar73 = pshufhw(auVar53,auVar53,0x84);
                      auVar52 = packssdw(auVar52 & auVar125,
                                         (auVar73 | auVar52 & auVar125) ^ auVar127);
                      if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                        psVar39[uVar33 * 4] = sVar8;
                      }
                      uVar33 = uVar33 + 8;
                    } while (((ulong)uVar12 + 7 & 0xfffffffffffffff8) != uVar33);
                  }
                }
                else if (0 < iVar31) {
                  cVar7 = -(uVar37 == 3);
                  uVar33 = 0;
                  do {
                    auVar52._8_4_ = (int)uVar33;
                    auVar52._0_8_ = uVar33;
                    auVar52._12_4_ = (int)(uVar33 >> 0x20);
                    auVar73 = auVar43 ^ auVar121;
                    auVar125 = (auVar52 | _DAT_0015ad30) ^ auVar121;
                    iVar13 = auVar73._0_4_;
                    iVar155 = -(uint)(iVar13 < auVar125._0_4_);
                    iVar35 = auVar73._4_4_;
                    auVar77._4_4_ = -(uint)(iVar35 < auVar125._4_4_);
                    iVar15 = auVar73._8_4_;
                    iVar120 = -(uint)(iVar15 < auVar125._8_4_);
                    iVar151 = auVar73._12_4_;
                    auVar77._12_4_ = -(uint)(iVar151 < auVar125._12_4_);
                    auVar104._4_4_ = iVar155;
                    auVar104._0_4_ = iVar155;
                    auVar104._8_4_ = iVar120;
                    auVar104._12_4_ = iVar120;
                    auVar78 = pshuflw(in_XMM5,auVar104,0xe8);
                    auVar73._4_4_ = -(uint)(auVar125._4_4_ == iVar35);
                    auVar73._12_4_ = -(uint)(auVar125._12_4_ == iVar151);
                    auVar73._0_4_ = auVar73._4_4_;
                    auVar73._8_4_ = auVar73._12_4_;
                    auVar47 = pshuflw(in_XMM6,auVar73,0xe8);
                    auVar77._0_4_ = auVar77._4_4_;
                    auVar77._8_4_ = auVar77._12_4_;
                    auVar125 = pshuflw(auVar78,auVar77,0xe8);
                    auVar125 = (auVar125 | auVar47 & auVar78) ^ auVar127;
                    auVar125 = packssdw(auVar125,auVar125);
                    if ((auVar125 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffe2) = cVar7;
                    }
                    auVar77 = auVar73 & auVar104 | auVar77;
                    auVar73 = packssdw(auVar77,auVar77);
                    auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                    auVar73 = packsswb(auVar73,auVar73);
                    if ((auVar73._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffe4) = cVar7;
                    }
                    auVar73 = (auVar52 | _DAT_0015ad20) ^ auVar121;
                    iVar155 = -(uint)(iVar13 < auVar73._0_4_);
                    auVar117._4_4_ = -(uint)(iVar35 < auVar73._4_4_);
                    iVar120 = -(uint)(iVar15 < auVar73._8_4_);
                    auVar117._12_4_ = -(uint)(iVar151 < auVar73._12_4_);
                    auVar125._4_4_ = iVar155;
                    auVar125._0_4_ = iVar155;
                    auVar125._8_4_ = iVar120;
                    auVar125._12_4_ = iVar120;
                    auVar105._4_4_ = -(uint)(auVar73._4_4_ == iVar35);
                    auVar105._12_4_ = -(uint)(auVar73._12_4_ == iVar151);
                    auVar105._0_4_ = auVar105._4_4_;
                    auVar105._8_4_ = auVar105._12_4_;
                    auVar117._0_4_ = auVar117._4_4_;
                    auVar117._8_4_ = auVar117._12_4_;
                    auVar73 = auVar105 & auVar125 | auVar117;
                    auVar73 = packssdw(auVar73,auVar73);
                    auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                    auVar73 = packsswb(auVar73,auVar73);
                    if ((auVar73._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffe6) = cVar7;
                    }
                    auVar125 = pshufhw(auVar125,auVar125,0x84);
                    auVar130 = pshufhw(auVar105,auVar105,0x84);
                    auVar77 = pshufhw(auVar125,auVar117,0x84);
                    auVar125 = (auVar77 | auVar130 & auVar125) ^ auVar127;
                    auVar125 = packssdw(auVar125,auVar125);
                    auVar125 = packsswb(auVar125,auVar125);
                    if ((auVar125._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffe8) = cVar7;
                    }
                    auVar125 = (auVar52 | _DAT_0015ad10) ^ auVar121;
                    iVar155 = -(uint)(iVar13 < auVar125._0_4_);
                    auVar83._4_4_ = -(uint)(iVar35 < auVar125._4_4_);
                    iVar120 = -(uint)(iVar15 < auVar125._8_4_);
                    auVar83._12_4_ = -(uint)(iVar151 < auVar125._12_4_);
                    auVar106._4_4_ = iVar155;
                    auVar106._0_4_ = iVar155;
                    auVar106._8_4_ = iVar120;
                    auVar106._12_4_ = iVar120;
                    auVar73 = pshuflw(auVar73,auVar106,0xe8);
                    auVar82._4_4_ = -(uint)(auVar125._4_4_ == iVar35);
                    auVar82._12_4_ = -(uint)(auVar125._12_4_ == iVar151);
                    auVar82._0_4_ = auVar82._4_4_;
                    auVar82._8_4_ = auVar82._12_4_;
                    auVar77 = pshuflw(auVar47 & auVar78,auVar82,0xe8);
                    auVar83._0_4_ = auVar83._4_4_;
                    auVar83._8_4_ = auVar83._12_4_;
                    auVar125 = pshuflw(auVar73,auVar83,0xe8);
                    auVar125 = (auVar125 | auVar77 & auVar73) ^ auVar127;
                    auVar125 = packssdw(auVar125,auVar125);
                    auVar125 = packsswb(auVar125,auVar125);
                    if ((auVar125 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffea) = cVar7;
                    }
                    auVar83 = auVar82 & auVar106 | auVar83;
                    auVar125 = packssdw(auVar83,auVar83);
                    auVar125 = packssdw(auVar125 ^ auVar127,auVar125 ^ auVar127);
                    auVar125 = packsswb(auVar125,auVar125);
                    if ((auVar125._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffec) = cVar7;
                    }
                    auVar125 = (auVar52 | _DAT_0015ad00) ^ auVar121;
                    iVar155 = -(uint)(iVar13 < auVar125._0_4_);
                    auVar118._4_4_ = -(uint)(iVar35 < auVar125._4_4_);
                    iVar120 = -(uint)(iVar15 < auVar125._8_4_);
                    auVar118._12_4_ = -(uint)(iVar151 < auVar125._12_4_);
                    auVar84._4_4_ = iVar155;
                    auVar84._0_4_ = iVar155;
                    auVar84._8_4_ = iVar120;
                    auVar84._12_4_ = iVar120;
                    auVar107._4_4_ = -(uint)(auVar125._4_4_ == iVar35);
                    auVar107._12_4_ = -(uint)(auVar125._12_4_ == iVar151);
                    auVar107._0_4_ = auVar107._4_4_;
                    auVar107._8_4_ = auVar107._12_4_;
                    auVar118._0_4_ = auVar118._4_4_;
                    auVar118._8_4_ = auVar118._12_4_;
                    auVar125 = auVar107 & auVar84 | auVar118;
                    auVar125 = packssdw(auVar125,auVar125);
                    auVar125 = packssdw(auVar125 ^ auVar127,auVar125 ^ auVar127);
                    auVar125 = packsswb(auVar125,auVar125);
                    if ((auVar125 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xffffffffffffffee) = cVar7;
                    }
                    auVar78 = pshufhw(auVar84,auVar84,0x84);
                    auVar130 = pshufhw(auVar107,auVar107,0x84);
                    auVar47 = pshufhw(auVar78,auVar118,0x84);
                    auVar78 = (auVar47 | auVar130 & auVar78) ^ auVar127;
                    auVar78 = packssdw(auVar78,auVar78);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffff0) = cVar7;
                    }
                    auVar78 = (auVar52 | _DAT_0015acf0) ^ auVar121;
                    iVar155 = -(uint)(iVar13 < auVar78._0_4_);
                    auVar86._4_4_ = -(uint)(iVar35 < auVar78._4_4_);
                    iVar120 = -(uint)(iVar15 < auVar78._8_4_);
                    auVar86._12_4_ = -(uint)(iVar151 < auVar78._12_4_);
                    auVar108._4_4_ = iVar155;
                    auVar108._0_4_ = iVar155;
                    auVar108._8_4_ = iVar120;
                    auVar108._12_4_ = iVar120;
                    auVar125 = pshuflw(auVar125,auVar108,0xe8);
                    auVar85._4_4_ = -(uint)(auVar78._4_4_ == iVar35);
                    auVar85._12_4_ = -(uint)(auVar78._12_4_ == iVar151);
                    auVar85._0_4_ = auVar85._4_4_;
                    auVar85._8_4_ = auVar85._12_4_;
                    auVar77 = pshuflw(auVar77 & auVar73,auVar85,0xe8);
                    auVar86._0_4_ = auVar86._4_4_;
                    auVar86._8_4_ = auVar86._12_4_;
                    auVar73 = pshuflw(auVar125,auVar86,0xe8);
                    auVar73 = (auVar73 | auVar77 & auVar125) ^ auVar127;
                    auVar73 = packssdw(auVar73,auVar73);
                    auVar73 = packsswb(auVar73,auVar73);
                    if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffff2) = cVar7;
                    }
                    auVar86 = auVar85 & auVar108 | auVar86;
                    auVar73 = packssdw(auVar86,auVar86);
                    auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                    auVar73 = packsswb(auVar73,auVar73);
                    if ((auVar73._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffff4) = cVar7;
                    }
                    auVar73 = (auVar52 | _DAT_0015ace0) ^ auVar121;
                    iVar155 = -(uint)(iVar13 < auVar73._0_4_);
                    auVar119._4_4_ = -(uint)(iVar35 < auVar73._4_4_);
                    iVar120 = -(uint)(iVar15 < auVar73._8_4_);
                    auVar119._12_4_ = -(uint)(iVar151 < auVar73._12_4_);
                    auVar87._4_4_ = iVar155;
                    auVar87._0_4_ = iVar155;
                    auVar87._8_4_ = iVar120;
                    auVar87._12_4_ = iVar120;
                    auVar109._4_4_ = -(uint)(auVar73._4_4_ == iVar35);
                    auVar109._12_4_ = -(uint)(auVar73._12_4_ == iVar151);
                    auVar109._0_4_ = auVar109._4_4_;
                    auVar109._8_4_ = auVar109._12_4_;
                    auVar119._0_4_ = auVar119._4_4_;
                    auVar119._8_4_ = auVar119._12_4_;
                    auVar73 = auVar109 & auVar87 | auVar119;
                    auVar73 = packssdw(auVar73,auVar73);
                    auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                    auVar73 = packsswb(auVar73,auVar73);
                    if ((auVar73 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffff6) = cVar7;
                    }
                    auVar78 = pshufhw(auVar87,auVar87,0x84);
                    auVar130 = pshufhw(auVar109,auVar109,0x84);
                    auVar47 = pshufhw(auVar78,auVar119,0x84);
                    auVar78 = (auVar47 | auVar130 & auVar78) ^ auVar127;
                    auVar78 = packssdw(auVar78,auVar78);
                    auVar78 = packsswb(auVar78,auVar78);
                    if ((auVar78._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffff8) = cVar7;
                    }
                    auVar78 = (auVar52 | _DAT_0015acd0) ^ auVar121;
                    iVar155 = -(uint)(iVar13 < auVar78._0_4_);
                    auVar89._4_4_ = -(uint)(iVar35 < auVar78._4_4_);
                    iVar120 = -(uint)(iVar15 < auVar78._8_4_);
                    auVar89._12_4_ = -(uint)(iVar151 < auVar78._12_4_);
                    auVar110._4_4_ = iVar155;
                    auVar110._0_4_ = iVar155;
                    auVar110._8_4_ = iVar120;
                    auVar110._12_4_ = iVar120;
                    auVar73 = pshuflw(auVar73,auVar110,0xe8);
                    auVar88._4_4_ = -(uint)(auVar78._4_4_ == iVar35);
                    auVar88._12_4_ = -(uint)(auVar78._12_4_ == iVar151);
                    auVar88._0_4_ = auVar88._4_4_;
                    auVar88._8_4_ = auVar88._12_4_;
                    in_XMM6 = pshuflw(auVar77 & auVar125,auVar88,0xe8);
                    in_XMM6 = in_XMM6 & auVar73;
                    auVar89._0_4_ = auVar89._4_4_;
                    auVar89._8_4_ = auVar89._12_4_;
                    auVar73 = pshuflw(auVar73,auVar89,0xe8);
                    auVar73 = (auVar73 | in_XMM6) ^ auVar127;
                    auVar73 = packssdw(auVar73,auVar73);
                    in_XMM5 = packsswb(auVar73,auVar73);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffffa) = cVar7;
                    }
                    auVar89 = auVar88 & auVar110 | auVar89;
                    auVar73 = packssdw(auVar89,auVar89);
                    auVar73 = packssdw(auVar73 ^ auVar127,auVar73 ^ auVar127);
                    auVar73 = packsswb(auVar73,auVar73);
                    if ((auVar73._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffffc) = cVar7;
                    }
                    auVar52 = (auVar52 | _DAT_0015acc0) ^ auVar121;
                    auVar111._0_4_ = -(uint)(iVar13 < auVar52._0_4_);
                    auVar111._4_4_ = -(uint)(iVar35 < auVar52._4_4_);
                    auVar111._8_4_ = -(uint)(iVar15 < auVar52._8_4_);
                    auVar111._12_4_ = -(uint)(iVar151 < auVar52._12_4_);
                    auVar90._4_4_ = auVar111._0_4_;
                    auVar90._0_4_ = auVar111._0_4_;
                    auVar90._8_4_ = auVar111._8_4_;
                    auVar90._12_4_ = auVar111._8_4_;
                    auVar46._4_4_ = -(uint)(auVar52._4_4_ == iVar35);
                    auVar46._12_4_ = -(uint)(auVar52._12_4_ == iVar151);
                    auVar46._0_4_ = auVar46._4_4_;
                    auVar46._8_4_ = auVar46._12_4_;
                    auVar54._4_4_ = auVar111._4_4_;
                    auVar54._0_4_ = auVar111._4_4_;
                    auVar54._8_4_ = auVar111._12_4_;
                    auVar54._12_4_ = auVar111._12_4_;
                    auVar52 = packssdw(auVar111,auVar46 & auVar90 | auVar54);
                    auVar52 = packssdw(auVar52 ^ auVar127,auVar52 ^ auVar127);
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar40 + uVar33 * 2 + 0xfffffffffffffffe) = cVar7;
                    }
                    auVar125 = pshufhw(auVar90,auVar90,0x84);
                    auVar52 = pshufhw(auVar46,auVar46,0x84);
                    auVar73 = pshufhw(auVar54,auVar54,0x84);
                    auVar52 = packssdw(auVar52 & auVar125,(auVar73 | auVar52 & auVar125) ^ auVar127)
                    ;
                    auVar52 = packsswb(auVar52,auVar52);
                    if ((auVar52._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar40 + uVar33 * 2) = cVar7;
                    }
                    uVar33 = uVar33 + 0x10;
                  } while (((ulong)uVar12 + 0xf & 0xfffffffffffffff0) != uVar33);
                }
                uVar37 = uVar37 + 1;
                psVar40 = (stbi__uint16 *)((long)psVar40 + 1);
                psVar39 = psVar39 + 1;
                local_8910 = (stbi__uint16 *)((long)local_8910 + 1);
                local_8930 = local_8930 + 1;
              } while (uVar37 != 4);
            }
            else {
              stbi__skip(s,uVar10 * uVar16 * 2);
              lVar30 = (ulong)((uVar14 | uVar25) * (uVar29 | uVar34)) - 1;
              auVar126._8_4_ = (int)lVar30;
              auVar126._0_8_ = lVar30;
              auVar126._12_4_ = (int)((ulong)lVar30 >> 0x20);
              psVar39 = data_02 + 0x1e;
              uVar37 = 0;
              auVar121 = _DAT_0015acc0;
              auVar43 = _DAT_0015acd0;
              auVar127 = _DAT_0015ace0;
              auVar52 = _DAT_0015acf0;
              auVar73 = _DAT_0015ad00;
              auVar125 = _DAT_0015ad10;
              auVar77 = _DAT_0015ad20;
              auVar78 = _DAT_0015ad30;
              do {
                if (uVar37 < uVar10) {
                  iVar9 = stbi__psd_decode_rle(s,(stbi_uc *)((long)data_02 + uVar37),iVar31);
                  auVar121 = _DAT_0015acc0;
                  auVar43 = _DAT_0015acd0;
                  auVar127 = _DAT_0015ace0;
                  auVar52 = _DAT_0015acf0;
                  auVar73 = _DAT_0015ad00;
                  auVar125 = _DAT_0015ad10;
                  auVar77 = _DAT_0015ad20;
                  auVar78 = _DAT_0015ad30;
                  if (iVar9 == 0) {
                    free(data_02);
                    pcVar18 = "corrupt";
                    goto LAB_00119d2e;
                  }
                }
                else if (0 < iVar31) {
                  cVar7 = -(uVar37 == 3);
                  uVar33 = 0;
                  do {
                    auVar41._8_4_ = (int)uVar33;
                    auVar41._0_8_ = uVar33;
                    auVar41._12_4_ = (int)(uVar33 >> 0x20);
                    auVar47 = auVar126 ^ _DAT_00154640;
                    auVar130 = (auVar41 | auVar78) ^ _DAT_00154640;
                    iVar9 = auVar47._0_4_;
                    iVar151 = -(uint)(iVar9 < auVar130._0_4_);
                    iVar13 = auVar47._4_4_;
                    auVar56._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
                    iVar35 = auVar47._8_4_;
                    iVar155 = -(uint)(iVar35 < auVar130._8_4_);
                    iVar15 = auVar47._12_4_;
                    auVar56._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
                    auVar92._4_4_ = iVar151;
                    auVar92._0_4_ = iVar151;
                    auVar92._8_4_ = iVar155;
                    auVar92._12_4_ = iVar155;
                    auVar47 = pshuflw(in_XMM5,auVar92,0xe8);
                    auVar55._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
                    auVar55._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
                    auVar55._0_4_ = auVar55._4_4_;
                    auVar55._8_4_ = auVar55._12_4_;
                    auVar132 = pshuflw(in_XMM6,auVar55,0xe8);
                    auVar56._0_4_ = auVar56._4_4_;
                    auVar56._8_4_ = auVar56._12_4_;
                    auVar130 = pshuflw(auVar47,auVar56,0xe8);
                    auVar122._8_4_ = 0xffffffff;
                    auVar122._0_8_ = 0xffffffffffffffff;
                    auVar122._12_4_ = 0xffffffff;
                    auVar47 = (auVar130 | auVar132 & auVar47) ^ auVar122;
                    auVar47 = packssdw(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffe2) = cVar7;
                    }
                    auVar56 = auVar55 & auVar92 | auVar56;
                    auVar47 = packssdw(auVar56,auVar56);
                    auVar47 = packssdw(auVar47 ^ auVar122,auVar47 ^ auVar122);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47._0_4_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffe4) = cVar7;
                    }
                    auVar47 = (auVar41 | auVar77) ^ _DAT_00154640;
                    iVar151 = -(uint)(iVar9 < auVar47._0_4_);
                    auVar113._4_4_ = -(uint)(iVar13 < auVar47._4_4_);
                    iVar155 = -(uint)(iVar35 < auVar47._8_4_);
                    auVar113._12_4_ = -(uint)(iVar15 < auVar47._12_4_);
                    auVar57._4_4_ = iVar151;
                    auVar57._0_4_ = iVar151;
                    auVar57._8_4_ = iVar155;
                    auVar57._12_4_ = iVar155;
                    auVar93._4_4_ = -(uint)(auVar47._4_4_ == iVar13);
                    auVar93._12_4_ = -(uint)(auVar47._12_4_ == iVar15);
                    auVar93._0_4_ = auVar93._4_4_;
                    auVar93._8_4_ = auVar93._12_4_;
                    auVar113._0_4_ = auVar113._4_4_;
                    auVar113._8_4_ = auVar113._12_4_;
                    auVar47 = auVar93 & auVar57 | auVar113;
                    auVar47 = packssdw(auVar47,auVar47);
                    auVar47 = packssdw(auVar47 ^ auVar122,auVar47 ^ auVar122);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47._0_4_ >> 0x10 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffe6) = cVar7;
                    }
                    auVar130 = pshufhw(auVar57,auVar57,0x84);
                    auVar67 = pshufhw(auVar93,auVar93,0x84);
                    auVar132 = pshufhw(auVar130,auVar113,0x84);
                    auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar122;
                    auVar130 = packssdw(auVar130,auVar130);
                    auVar130 = packsswb(auVar130,auVar130);
                    if ((auVar130._0_4_ >> 0x18 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffe8) = cVar7;
                    }
                    auVar130 = (auVar41 | auVar125) ^ _DAT_00154640;
                    iVar151 = -(uint)(iVar9 < auVar130._0_4_);
                    auVar59._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
                    iVar155 = -(uint)(iVar35 < auVar130._8_4_);
                    auVar59._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
                    auVar94._4_4_ = iVar151;
                    auVar94._0_4_ = iVar151;
                    auVar94._8_4_ = iVar155;
                    auVar94._12_4_ = iVar155;
                    auVar47 = pshuflw(auVar47,auVar94,0xe8);
                    auVar58._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
                    auVar58._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
                    auVar58._0_4_ = auVar58._4_4_;
                    auVar58._8_4_ = auVar58._12_4_;
                    auVar132 = pshuflw(auVar122,auVar58,0xe8);
                    auVar59._0_4_ = auVar59._4_4_;
                    auVar59._8_4_ = auVar59._12_4_;
                    auVar130 = pshuflw(auVar47,auVar59,0xe8);
                    auVar123._8_4_ = 0xffffffff;
                    auVar123._0_8_ = 0xffffffffffffffff;
                    auVar123._12_4_ = 0xffffffff;
                    auVar47 = (auVar130 | auVar132 & auVar47) ^ auVar123;
                    auVar47 = packssdw(auVar47,auVar47);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffea) = cVar7;
                    }
                    auVar59 = auVar58 & auVar94 | auVar59;
                    auVar47 = packssdw(auVar59,auVar59);
                    auVar47 = packssdw(auVar47 ^ auVar123,auVar47 ^ auVar123);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47._4_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffec) = cVar7;
                    }
                    auVar47 = (auVar41 | auVar73) ^ _DAT_00154640;
                    iVar151 = -(uint)(iVar9 < auVar47._0_4_);
                    auVar114._4_4_ = -(uint)(iVar13 < auVar47._4_4_);
                    iVar155 = -(uint)(iVar35 < auVar47._8_4_);
                    auVar114._12_4_ = -(uint)(iVar15 < auVar47._12_4_);
                    auVar60._4_4_ = iVar151;
                    auVar60._0_4_ = iVar151;
                    auVar60._8_4_ = iVar155;
                    auVar60._12_4_ = iVar155;
                    auVar95._4_4_ = -(uint)(auVar47._4_4_ == iVar13);
                    auVar95._12_4_ = -(uint)(auVar47._12_4_ == iVar15);
                    auVar95._0_4_ = auVar95._4_4_;
                    auVar95._8_4_ = auVar95._12_4_;
                    auVar114._0_4_ = auVar114._4_4_;
                    auVar114._8_4_ = auVar114._12_4_;
                    auVar47 = auVar95 & auVar60 | auVar114;
                    auVar47 = packssdw(auVar47,auVar47);
                    auVar47 = packssdw(auVar47 ^ auVar123,auVar47 ^ auVar123);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xffffffffffffffee) = cVar7;
                    }
                    auVar130 = pshufhw(auVar60,auVar60,0x84);
                    auVar67 = pshufhw(auVar95,auVar95,0x84);
                    auVar132 = pshufhw(auVar130,auVar114,0x84);
                    auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar123;
                    auVar130 = packssdw(auVar130,auVar130);
                    auVar130 = packsswb(auVar130,auVar130);
                    if ((auVar130._6_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffff0) = cVar7;
                    }
                    auVar130 = (auVar41 | auVar52) ^ _DAT_00154640;
                    iVar151 = -(uint)(iVar9 < auVar130._0_4_);
                    auVar62._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
                    iVar155 = -(uint)(iVar35 < auVar130._8_4_);
                    auVar62._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
                    auVar96._4_4_ = iVar151;
                    auVar96._0_4_ = iVar151;
                    auVar96._8_4_ = iVar155;
                    auVar96._12_4_ = iVar155;
                    auVar47 = pshuflw(auVar47,auVar96,0xe8);
                    auVar61._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
                    auVar61._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
                    auVar61._0_4_ = auVar61._4_4_;
                    auVar61._8_4_ = auVar61._12_4_;
                    auVar132 = pshuflw(auVar123,auVar61,0xe8);
                    auVar62._0_4_ = auVar62._4_4_;
                    auVar62._8_4_ = auVar62._12_4_;
                    auVar130 = pshuflw(auVar47,auVar62,0xe8);
                    auVar124._8_4_ = 0xffffffff;
                    auVar124._0_8_ = 0xffffffffffffffff;
                    auVar124._12_4_ = 0xffffffff;
                    auVar47 = (auVar130 | auVar132 & auVar47) ^ auVar124;
                    auVar47 = packssdw(auVar47,auVar47);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffff2) = cVar7;
                    }
                    auVar62 = auVar61 & auVar96 | auVar62;
                    auVar47 = packssdw(auVar62,auVar62);
                    auVar47 = packssdw(auVar47 ^ auVar124,auVar47 ^ auVar124);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47._8_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffff4) = cVar7;
                    }
                    auVar47 = (auVar41 | auVar127) ^ _DAT_00154640;
                    iVar151 = -(uint)(iVar9 < auVar47._0_4_);
                    auVar115._4_4_ = -(uint)(iVar13 < auVar47._4_4_);
                    iVar155 = -(uint)(iVar35 < auVar47._8_4_);
                    auVar115._12_4_ = -(uint)(iVar15 < auVar47._12_4_);
                    auVar63._4_4_ = iVar151;
                    auVar63._0_4_ = iVar151;
                    auVar63._8_4_ = iVar155;
                    auVar63._12_4_ = iVar155;
                    auVar97._4_4_ = -(uint)(auVar47._4_4_ == iVar13);
                    auVar97._12_4_ = -(uint)(auVar47._12_4_ == iVar15);
                    auVar97._0_4_ = auVar97._4_4_;
                    auVar97._8_4_ = auVar97._12_4_;
                    auVar115._0_4_ = auVar115._4_4_;
                    auVar115._8_4_ = auVar115._12_4_;
                    auVar47 = auVar97 & auVar63 | auVar115;
                    auVar47 = packssdw(auVar47,auVar47);
                    auVar47 = packssdw(auVar47 ^ auVar124,auVar47 ^ auVar124);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffff6) = cVar7;
                    }
                    auVar130 = pshufhw(auVar63,auVar63,0x84);
                    auVar67 = pshufhw(auVar97,auVar97,0x84);
                    auVar132 = pshufhw(auVar130,auVar115,0x84);
                    auVar130 = (auVar132 | auVar67 & auVar130) ^ auVar124;
                    auVar130 = packssdw(auVar130,auVar130);
                    auVar130 = packsswb(auVar130,auVar130);
                    if ((auVar130._10_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffff8) = cVar7;
                    }
                    auVar130 = (auVar41 | auVar43) ^ _DAT_00154640;
                    iVar151 = -(uint)(iVar9 < auVar130._0_4_);
                    auVar65._4_4_ = -(uint)(iVar13 < auVar130._4_4_);
                    iVar155 = -(uint)(iVar35 < auVar130._8_4_);
                    auVar65._12_4_ = -(uint)(iVar15 < auVar130._12_4_);
                    auVar98._4_4_ = iVar151;
                    auVar98._0_4_ = iVar151;
                    auVar98._8_4_ = iVar155;
                    auVar98._12_4_ = iVar155;
                    auVar47 = pshuflw(auVar47,auVar98,0xe8);
                    auVar64._4_4_ = -(uint)(auVar130._4_4_ == iVar13);
                    auVar64._12_4_ = -(uint)(auVar130._12_4_ == iVar15);
                    auVar64._0_4_ = auVar64._4_4_;
                    auVar64._8_4_ = auVar64._12_4_;
                    auVar132 = pshuflw(auVar124,auVar64,0xe8);
                    auVar65._0_4_ = auVar65._4_4_;
                    auVar65._8_4_ = auVar65._12_4_;
                    auVar130 = pshuflw(auVar47,auVar65,0xe8);
                    in_XMM6._8_4_ = 0xffffffff;
                    in_XMM6._0_8_ = 0xffffffffffffffff;
                    in_XMM6._12_4_ = 0xffffffff;
                    auVar47 = (auVar130 | auVar132 & auVar47) ^ in_XMM6;
                    auVar47 = packssdw(auVar47,auVar47);
                    in_XMM5 = packsswb(auVar47,auVar47);
                    if ((in_XMM5 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffffa) = cVar7;
                    }
                    auVar65 = auVar64 & auVar98 | auVar65;
                    auVar47 = packssdw(auVar65,auVar65);
                    auVar47 = packssdw(auVar47 ^ in_XMM6,auVar47 ^ in_XMM6);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47._12_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffffc) = cVar7;
                    }
                    auVar47 = (auVar41 | auVar121) ^ _DAT_00154640;
                    auVar99._0_4_ = -(uint)(iVar9 < auVar47._0_4_);
                    auVar99._4_4_ = -(uint)(iVar13 < auVar47._4_4_);
                    auVar99._8_4_ = -(uint)(iVar35 < auVar47._8_4_);
                    auVar99._12_4_ = -(uint)(iVar15 < auVar47._12_4_);
                    auVar66._4_4_ = auVar99._0_4_;
                    auVar66._0_4_ = auVar99._0_4_;
                    auVar66._8_4_ = auVar99._8_4_;
                    auVar66._12_4_ = auVar99._8_4_;
                    auVar42._4_4_ = -(uint)(auVar47._4_4_ == iVar13);
                    auVar42._12_4_ = -(uint)(auVar47._12_4_ == iVar15);
                    auVar42._0_4_ = auVar42._4_4_;
                    auVar42._8_4_ = auVar42._12_4_;
                    auVar48._4_4_ = auVar99._4_4_;
                    auVar48._0_4_ = auVar99._4_4_;
                    auVar48._8_4_ = auVar99._12_4_;
                    auVar48._12_4_ = auVar99._12_4_;
                    auVar47 = packssdw(auVar99,auVar42 & auVar66 | auVar48);
                    auVar47 = packssdw(auVar47 ^ in_XMM6,auVar47 ^ in_XMM6);
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                      *(char *)(psVar39 + uVar33 * 2 + 0xfffffffffffffffe) = cVar7;
                    }
                    auVar132 = pshufhw(auVar66,auVar66,0x84);
                    auVar47 = pshufhw(auVar42,auVar42,0x84);
                    auVar130 = pshufhw(auVar48,auVar48,0x84);
                    auVar47 = packssdw(auVar47 & auVar132,(auVar130 | auVar47 & auVar132) ^ in_XMM6)
                    ;
                    auVar47 = packsswb(auVar47,auVar47);
                    if ((auVar47._14_2_ >> 8 & 1) != 0) {
                      *(char *)(psVar39 + uVar33 * 2) = cVar7;
                    }
                    uVar33 = uVar33 + 0x10;
                  } while (((ulong)((uVar14 + uVar25) * (uVar29 + uVar34)) + 0xf &
                           0xfffffffffffffff0) != uVar33);
                }
                uVar37 = uVar37 + 1;
                psVar39 = (stbi__uint16 *)((long)psVar39 + 1);
              } while (uVar37 != 4);
            }
            if (3 < uVar10) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar31) {
                  uVar37 = 0;
                  do {
                    uVar2 = data_02[uVar37 * 4 + 3];
                    if ((uVar2 != 0) && (uVar2 != 0xffff)) {
                      fVar112 = 1.0 / ((float)uVar2 / 65535.0);
                      fVar91 = (1.0 - fVar112) * 65535.0;
                      auVar121._0_4_ =
                           (int)(fVar91 + fVar112 * (float)(*(uint *)(data_02 + uVar37 * 4) & 0xffff
                                                           ));
                      auVar121._4_4_ =
                           (int)(fVar91 + fVar112 * (float)(*(uint *)(data_02 + uVar37 * 4) >> 0x10)
                                );
                      auVar121._8_4_ = (int)(fVar91 + fVar112 * 0.0);
                      auVar121._12_4_ = (int)(fVar91 + fVar112 * 0.0);
                      auVar121 = pshuflw(auVar121,auVar121,0xe8);
                      *(int *)(data_02 + uVar37 * 4) = auVar121._0_4_;
                      data_02[uVar37 * 4 + 2] =
                           (stbi__uint16)(int)((float)data_02[uVar37 * 4 + 2] * fVar112 + fVar91);
                    }
                    uVar37 = uVar37 + 1;
                  } while ((uVar14 + uVar25) * (uVar29 + uVar34) != uVar37);
                }
              }
              else if (0 < iVar31) {
                uVar37 = 0;
                do {
                  bVar24 = *(byte *)((long)data_02 + uVar37 * 4 + 3);
                  if ((bVar24 != 0) && (bVar24 != 0xff)) {
                    fVar112 = 1.0 / ((float)bVar24 / 255.0);
                    fVar91 = (1.0 - fVar112) * 255.0;
                    *(char *)(data_02 + uVar37 * 2) =
                         (char)(int)((float)(byte)data_02[uVar37 * 2] * fVar112 + fVar91);
                    *(char *)((long)data_02 + uVar37 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)data_02 + uVar37 * 4 + 1) * fVar112 +
                                    fVar91);
                    *(char *)(data_02 + uVar37 * 2 + 1) =
                         (char)(int)((float)(byte)data_02[uVar37 * 2 + 1] * fVar112 + fVar91);
                  }
                  uVar37 = uVar37 + 1;
                } while ((uVar14 + uVar25) * (uVar29 + uVar34) != uVar37);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                data_02 = stbi__convert_format16(data_02,4,req_comp,x_00,uVar16);
              }
              else {
                data_02 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)data_02,4,req_comp,x_00,uVar16);
              }
              if (data_02 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar16;
            *x = x_00;
            return data_02;
          }
          goto LAB_0011b2bc;
        }
      }
    }
  }
LAB_0011a873:
  pcVar18 = "too large";
LAB_00119d2e:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar18;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}